

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

void __thiscall MeCab::anon_unknown_0::LatticeImpl::~LatticeImpl(LatticeImpl *this)

{
  Allocator<mecab_node_t,_mecab_path_t> *pAVar1;
  StringBuffer *pSVar2;
  pointer puVar3;
  pointer ppcVar4;
  pointer ppmVar5;
  pointer pcVar6;
  
  (this->super_Lattice)._vptr_Lattice = (_func_int **)&PTR_clear_001726e0;
  (this->allocator_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172a88;
  pAVar1 = (this->allocator_).ptr_;
  if (pAVar1 != (Allocator<mecab_node_t,_mecab_path_t> *)0x0) {
    (*pAVar1->_vptr_Allocator[1])();
  }
  (this->ostrs_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172908;
  pSVar2 = (this->ostrs_).ptr_;
  if (pSVar2 != (StringBuffer *)0x0) {
    (*pSVar2->_vptr_StringBuffer[1])();
  }
  puVar3 = (this->boundary_constraint_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  ppcVar4 = (this->feature_constraint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar4 != (pointer)0x0) {
    operator_delete(ppcVar4);
  }
  ppmVar5 = (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppmVar5 != (pointer)0x0) {
    operator_delete(ppmVar5);
  }
  ppmVar5 = (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppmVar5 != (pointer)0x0) {
    operator_delete(ppmVar5);
  }
  pcVar6 = (this->what_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->what_).field_2) {
    operator_delete(pcVar6);
    return;
  }
  return;
}

Assistant:

LatticeImpl::~LatticeImpl() {}